

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ExtensionSet::ExtensionSet(ExtensionSet *this)

{
  this->arena_ = (Arena *)0x0;
  this->flat_capacity_ = 0;
  this->flat_size_ = 0;
  (this->map_).flat = (KeyValue *)0x0;
  return;
}

Assistant:

ExtensionSet::ExtensionSet()
    : arena_(NULL),
      flat_capacity_(0),
      flat_size_(0),
      map_{flat_capacity_ == 0
               ? NULL
               : Arena::CreateArray<KeyValue>(arena_, flat_capacity_)} {}